

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListAppendGrow(sqlite3 *db,ExprList *pList,Expr *pExpr)

{
  char **ppcVar1;
  int iVar2;
  ExprList *pEVar3;
  
  iVar2 = pList->nAlloc;
  pList->nAlloc = iVar2 * 2;
  pEVar3 = (ExprList *)sqlite3DbRealloc(db,pList,(long)iVar2 * 0x30 + 8);
  if (pEVar3 == (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
    if (pExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pExpr);
    }
  }
  else {
    iVar2 = pEVar3->nExpr;
    pEVar3->nExpr = iVar2 + 1;
    ppcVar1 = &pEVar3->a[iVar2].zEName;
    *ppcVar1 = (char *)0x0;
    *(undefined8 *)(ppcVar1 + 1) = 0;
    pEVar3->a[iVar2].pExpr = pExpr;
  }
  return pEVar3;
}

Assistant:

ExprList *sqlite3ExprListAppendGrow(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pNew;
  pList->nAlloc *= 2;
  pNew = sqlite3DbRealloc(db, pList,
       sizeof(*pList)+(pList->nAlloc-1)*sizeof(pList->a[0]));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList);
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }else{
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}